

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O3

size_t xmi_process_chunks(PBuffer *buffer,MidiFile *midi)

{
  Buffer *this;
  Logger *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  element_type *in_RAX;
  Stream *pSVar5;
  iterator iVar6;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *_size;
  PBuffer PVar7;
  string name;
  PBuffer content;
  PBuffer id;
  undefined1 local_c8 [32];
  undefined1 local_a8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined8 local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined4 *local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  _func_int **local_48;
  element_type *local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  _size = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (_size->size != 0) {
    this = (Buffer *)(local_c8 + 0x20);
    this_00 = (Logger *)(local_a8 + 0x10);
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)midi;
    do {
      p_Var1 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      Buffer::pop((Buffer *)&stack0xffffffffffffffb8,(size_t)_size);
      local_c8._0_8_ = local_c8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,local_48[3],local_48[4] + (long)local_48[3]);
      _size->read = _size->read + 4;
      local_68 = &local_58;
      local_58 = 0x32696d78;
      local_60 = 7;
      uStack_54 = 0x64696d;
      Log::Logger::operator[]((Logger *)this,(string *)&Log::Verbose);
      pSVar5 = Log::Stream::operator<<((Stream *)this,"Processing XMI chunk: ");
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->stream,(char *)local_c8._0_8_,local_c8._8_8_);
      pSVar5 = Log::Stream::operator<<(pSVar5," (size: ");
      std::ostream::_M_insert<unsigned_long>((ulong)pSVar5->stream);
      Log::Stream::operator<<(pSVar5,")");
      Log::Stream::~Stream((Stream *)this);
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT44(uStack_54,local_58) + 1);
      }
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>_>_>
              ::find(&xmi_processors_abi_cxx11_._M_t,(key_type *)local_c8);
      if ((_Rb_tree_header *)iVar6._M_node ==
          &xmi_processors_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        Buffer::pop(this,(size_t)_size);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        local_88 = &local_78;
        local_78._M_allocated_capacity._0_4_ = 0x32696d78;
        local_80._0_4_ = 7;
        local_80._4_4_ = 0;
        local_78._M_allocated_capacity._4_4_ = 0x64696d;
        Log::Logger::operator[](this_00,(string *)&Log::Debug);
        pSVar5 = Log::Stream::operator<<((Stream *)this_00,"Unknown XMI chunk: ");
        std::ostream::_M_insert<void_const*>(pSVar5->stream);
        Log::Stream::~Stream((Stream *)this_00);
        if (local_88 != &local_78) {
          operator_delete(local_88,CONCAT44(local_78._M_allocated_capacity._4_4_,
                                            local_78._M_allocated_capacity._0_4_) + 1);
        }
      }
      else {
        Buffer::pop(this,(size_t)_size);
        pcVar2 = *(code **)(iVar6._M_node + 2);
        local_a8._16_8_ = local_a8._0_8_;
        local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
          }
        }
        (*pcVar2)(this_00,local_38._M_pi);
        if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
      }
      if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if (local_40 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      PVar7 = Buffer::get_tail((Buffer *)local_c8,
                               (size_t)(buffer->
                                       super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr);
      uVar4 = local_c8._8_8_;
      uVar3 = local_c8._0_8_;
      in_RAX = PVar7.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c8._0_8_ = (pointer)0x0;
      local_c8._8_8_ = (element_type *)0x0;
      p_Var1 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)uVar3;
      (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
         in_RAX = extraout_RAX, (element_type *)local_c8._8_8_ != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        in_RAX = extraout_RAX_00;
      }
      _size = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    } while (_size->size != 0);
  }
  return (size_t)in_RAX;
}

Assistant:

static size_t
xmi_process_chunks(PBuffer buffer, MidiFile *midi) {
  size_t length = buffer->get_size();

  while (buffer->get_size()) {
    size_t size = xmi_process_chunk(buffer, midi);
    buffer = buffer->get_tail(size);
  }

  return length;
}